

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

void nn_sinproc_term(nn_sinproc *self)

{
  long in_RDI;
  nn_msgqueue *in_stack_00000060;
  
  nn_list_item_term((nn_list_item *)0x1e7775);
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 600));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x230));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x208));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x1e0));
  nn_msg_term((nn_msg *)0x1e77c5);
  nn_msgqueue_term(in_stack_00000060);
  nn_pipebase_term((nn_pipebase *)0x1e77e2);
  nn_fsm_term((nn_fsm *)0x1e77eb);
  return;
}

Assistant:

void nn_sinproc_term (struct nn_sinproc *self)
{
    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->event_disconnect);
    nn_fsm_event_term (&self->event_received);
    nn_fsm_event_term (&self->event_sent);
    nn_fsm_event_term (&self->event_connect);
    nn_msg_term (&self->msg);
    nn_msgqueue_term (&self->msgqueue);
    nn_pipebase_term (&self->pipebase);
    nn_fsm_term (&self->fsm);
}